

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_filetime.c
# Opt level: O0

void setfiletime(curl_off_t filetime,char *filename,FILE *error_stream)

{
  __time_t __stream;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  undefined1 local_30 [8];
  utimbuf times;
  FILE *error_stream_local;
  char *filename_local;
  curl_off_t filetime_local;
  
  if ((-1 < filetime) &&
     (local_30 = (undefined1  [8])filetime, times.actime = filetime,
     times.modtime = (__time_t)error_stream, iVar1 = utime(filename,(utimbuf *)local_30),
     __stream = times.modtime, iVar1 != 0)) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    fprintf((FILE *)__stream,"Failed to set filetime %ld on outfile: %s\n",filetime,pcVar3);
  }
  return;
}

Assistant:

void setfiletime(curl_off_t filetime, const char *filename,
    FILE *error_stream)
{
  if(filetime >= 0) {
/* Windows utime() may attempt to adjust the unix GMT file time by a daylight
   saving time offset and since it's GMT that is bad behavior. When we have
   access to a 64-bit type we can bypass utime and set the times directly. */
#if defined(WIN32) && (SIZEOF_CURL_OFF_T >= 8)
    HANDLE hfile;
    TCHAR *tchar_filename = curlx_convert_UTF8_to_tchar((char *)filename);

    /* 910670515199 is the maximum unix filetime that can be used as a
       Windows FILETIME without overflow: 30827-12-31T23:59:59. */
    if(filetime > CURL_OFF_T_C(910670515199)) {
      fprintf(error_stream,
              "Failed to set filetime %" CURL_FORMAT_CURL_OFF_T
              " on outfile: overflow\n", filetime);
      curlx_unicodefree(tchar_filename);
      return;
    }

    hfile = CreateFile(tchar_filename, FILE_WRITE_ATTRIBUTES,
                        (FILE_SHARE_READ | FILE_SHARE_WRITE |
                         FILE_SHARE_DELETE),
                        NULL, OPEN_EXISTING, 0, NULL);
    curlx_unicodefree(tchar_filename);
    if(hfile != INVALID_HANDLE_VALUE) {
      curl_off_t converted = ((curl_off_t)filetime * 10000000) +
                             CURL_OFF_T_C(116444736000000000);
      FILETIME ft;
      ft.dwLowDateTime = (DWORD)(converted & 0xFFFFFFFF);
      ft.dwHighDateTime = (DWORD)(converted >> 32);
      if(!SetFileTime(hfile, NULL, &ft, &ft)) {
        fprintf(error_stream,
                "Failed to set filetime %" CURL_FORMAT_CURL_OFF_T
                " on outfile: SetFileTime failed: GetLastError %u\n",
                filetime, (unsigned int)GetLastError());
      }
      CloseHandle(hfile);
    }
    else {
      fprintf(error_stream,
              "Failed to set filetime %" CURL_FORMAT_CURL_OFF_T
              " on outfile: CreateFile failed: GetLastError %u\n",
              filetime, (unsigned int)GetLastError());
    }

#elif defined(HAVE_UTIMES)
    struct timeval times[2];
    times[0].tv_sec = times[1].tv_sec = (time_t)filetime;
    times[0].tv_usec = times[1].tv_usec = 0;
    if(utimes(filename, times)) {
      fprintf(error_stream,
              "Failed to set filetime %" CURL_FORMAT_CURL_OFF_T
              " on outfile: %s\n", filetime, strerror(errno));
    }

#elif defined(HAVE_UTIME)
    struct utimbuf times;
    times.actime = (time_t)filetime;
    times.modtime = (time_t)filetime;
    if(utime(filename, &times)) {
      fprintf(error_stream,
              "Failed to set filetime %" CURL_FORMAT_CURL_OFF_T
              " on outfile: %s\n", filetime, strerror(errno));
    }
#endif
  }
}